

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctaes.c
# Opt level: O0

void SubBytes(AES_state *s,int inv)

{
  long lVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  ushort uVar10;
  ushort uVar11;
  int in_ESI;
  ushort *in_RDI;
  long in_FS_OFFSET;
  uint16_t L29;
  uint16_t L28;
  uint16_t L27;
  uint16_t L26;
  uint16_t L25;
  uint16_t L24;
  uint16_t L23;
  uint16_t L22;
  uint16_t L21;
  uint16_t L20;
  uint16_t L19;
  uint16_t L18;
  uint16_t L17;
  uint16_t L16;
  uint16_t L15;
  uint16_t L14;
  uint16_t L13;
  uint16_t L12;
  uint16_t L11;
  uint16_t L10;
  uint16_t L9;
  uint16_t L8;
  uint16_t L7;
  uint16_t L6;
  uint16_t L5;
  uint16_t L4;
  uint16_t L3;
  uint16_t L2;
  uint16_t L1;
  uint16_t L0;
  uint16_t P29;
  uint16_t P28;
  uint16_t P27;
  uint16_t P26;
  uint16_t P25;
  uint16_t P24;
  uint16_t P23;
  uint16_t P22;
  uint16_t P20;
  uint16_t P19;
  uint16_t P18;
  uint16_t P17;
  uint16_t P16;
  uint16_t P15;
  uint16_t P14;
  uint16_t P13;
  uint16_t P12;
  uint16_t P11;
  uint16_t P10;
  uint16_t P9;
  uint16_t P8;
  uint16_t P7;
  uint16_t P6;
  uint16_t P5;
  uint16_t P4;
  uint16_t P3;
  uint16_t P2;
  uint16_t P1;
  uint16_t P0;
  uint16_t R19;
  uint16_t R18;
  uint16_t R17;
  uint16_t R13;
  uint16_t R5;
  uint16_t M63;
  uint16_t M62;
  uint16_t M61;
  uint16_t M60;
  uint16_t M59;
  uint16_t M58;
  uint16_t M57;
  uint16_t M56;
  uint16_t M55;
  uint16_t M54;
  uint16_t M53;
  uint16_t M52;
  uint16_t M51;
  uint16_t M50;
  uint16_t M49;
  uint16_t M48;
  uint16_t M47;
  uint16_t M46;
  uint16_t M45;
  uint16_t M44;
  uint16_t M43;
  uint16_t M42;
  uint16_t M41;
  uint16_t M40;
  uint16_t M39;
  uint16_t M38;
  uint16_t M37;
  uint16_t M25;
  uint16_t M23;
  uint16_t M22;
  uint16_t M21;
  uint16_t M20;
  uint16_t M15;
  uint16_t M13;
  uint16_t M11;
  uint16_t M6;
  uint16_t M1;
  uint16_t D;
  uint16_t T27;
  uint16_t T26;
  uint16_t T25;
  uint16_t T24;
  uint16_t T23;
  uint16_t T22;
  uint16_t T21;
  uint16_t T20;
  uint16_t T19;
  uint16_t T18;
  uint16_t T17;
  uint16_t T16;
  uint16_t T15;
  uint16_t T14;
  uint16_t T13;
  uint16_t T12;
  uint16_t T11;
  uint16_t T10;
  uint16_t T9;
  uint16_t T8;
  uint16_t T7;
  uint16_t T6;
  uint16_t T5;
  uint16_t T4;
  uint16_t T3;
  uint16_t T2;
  uint16_t T1;
  uint16_t U7;
  uint16_t U6;
  uint16_t U5;
  uint16_t U4;
  uint16_t U3;
  uint16_t U2;
  uint16_t U1;
  uint16_t U0;
  ushort local_5c;
  ushort local_5a;
  ushort local_58;
  ushort local_56;
  ushort local_54;
  ushort local_52;
  ushort local_50;
  ushort local_4c;
  ushort local_4a;
  ushort local_46;
  ushort local_44;
  ushort local_42;
  ushort local_40;
  ushort local_3e;
  ushort local_38;
  ushort local_36;
  ushort local_34;
  ushort local_30;
  ushort local_2c;
  ushort local_2a;
  ushort local_28;
  ushort local_26;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar8 = in_RDI[7];
  uVar3 = in_RDI[6];
  uVar4 = in_RDI[5];
  uVar2 = in_RDI[4];
  local_44 = in_RDI[3];
  uVar5 = in_RDI[2];
  uVar7 = in_RDI[1];
  local_5c = *in_RDI;
  if (in_ESI == 0) {
    local_26 = uVar8 ^ uVar2;
    local_28 = uVar8 ^ uVar5;
    local_2a = uVar8 ^ uVar7;
    local_2c = uVar2 ^ uVar5;
    local_44 = local_44 ^ uVar7;
    local_30 = local_26 ^ local_44;
    local_50 = uVar3 ^ uVar4;
    local_34 = local_5c ^ local_30;
    local_36 = local_5c ^ local_50;
    local_38 = local_30 ^ local_50;
    local_3e = local_2a ^ local_2c;
    local_40 = local_30 ^ uVar3 ^ uVar5;
    local_42 = local_44 ^ uVar3 ^ uVar5;
    local_44 = local_44 ^ uVar4 ^ uVar5;
    local_46 = local_36 ^ local_44;
    local_4a = local_50 ^ uVar2 ^ local_5c;
    local_4c = local_26 ^ local_4a;
    local_50 = local_50 ^ uVar7 ^ local_5c;
    local_52 = local_28 ^ local_50;
    local_54 = local_28 ^ local_38;
    local_56 = local_4c ^ local_46;
    local_58 = local_2a ^ local_44;
    local_5a = local_26 ^ uVar4 ^ uVar5;
  }
  else {
    local_52 = uVar8 ^ uVar2;
    local_50 = uVar3 ^ uVar2 ^ 0xffff;
    local_28 = uVar8 ^ uVar3 ^ 0xffff;
    local_26 = uVar2 ^ local_44;
    local_54 = local_44 ^ local_5c ^ 0xffff;
    local_2a = uVar7 ^ local_5c;
    local_34 = uVar3 ^ local_52 ^ 0xffff;
    local_4a = local_50 ^ local_2a;
    local_36 = local_5c ^ local_26 ^ 0xffff;
    local_38 = local_28 ^ local_54;
    local_3e = local_28 ^ local_2a;
    local_2a = local_26 ^ local_2a;
    local_56 = uVar4 ^ local_26 ^ 0xffff;
    local_46 = uVar4 ^ local_4a ^ 0xffff;
    local_4c = local_54 ^ uVar3 ^ uVar7;
    local_2c = local_44 ^ local_34;
    local_30 = uVar4 ^ uVar5 ^ 0xffff;
    local_40 = uVar5 ^ uVar7 ^ 0xffff;
    local_5c = uVar8 ^ local_30;
    local_30 = local_50 ^ local_30;
    local_44 = uVar3 ^ uVar7 ^ uVar4 ^ local_44 ^ 0xffff;
    local_5a = local_26 ^ local_40;
    local_42 = local_38 ^ local_5a;
    local_40 = local_38 ^ local_40;
    local_58 = local_2a ^ local_44;
  }
  uVar2 = local_2c & local_5a ^ local_26 & local_42;
  uVar8 = local_28 & local_38 ^ local_26 & local_42;
  uVar3 = local_40 ^ local_3e & local_30 ^ local_52 & local_34 ^ uVar2;
  uVar4 = local_4a & local_5c ^ local_3e & local_30 ^ local_54 ^ uVar8;
  uVar2 = local_58 ^ local_2a & local_44 ^ local_50 & local_36 ^ uVar2;
  local_56 = local_4c & local_46 ^ local_2a & local_44 ^ uVar8 ^ local_56;
  uVar8 = uVar2 & uVar3;
  uVar5 = uVar4 ^ (uVar3 ^ uVar4) & (local_56 ^ uVar8);
  uVar6 = uVar3 ^ uVar8 ^ (uVar4 | uVar3 & local_56);
  uVar7 = local_56 ^ (uVar2 ^ local_56) & (uVar4 ^ uVar8);
  uVar8 = uVar2 ^ uVar8 ^ (local_56 | uVar4 & uVar2);
  uVar4 = uVar6 ^ uVar8;
  uVar3 = uVar5 ^ uVar7;
  local_30 = (uVar7 ^ uVar8) & local_30;
  local_5c = uVar7 & local_5c;
  local_44 = (uVar5 ^ uVar6) & local_44;
  local_36 = uVar6 & local_36;
  local_46 = uVar5 & local_46;
  local_42 = uVar3 & local_42;
  local_5a = (uVar3 ^ uVar4) & local_5a;
  local_38 = uVar4 & local_38;
  local_3e = (uVar7 ^ uVar8) & local_3e;
  local_52 = uVar8 & local_52;
  uVar7 = uVar7 & local_4a;
  local_2a = (uVar5 ^ uVar6) & local_2a;
  uVar6 = uVar6 & local_50;
  local_26 = uVar3 & local_26;
  local_2c = (uVar3 ^ uVar4) & local_2c;
  uVar4 = uVar4 & local_28;
  if (in_ESI == 0) {
    uVar3 = local_26 ^ local_2c;
    uVar2 = local_36 ^ local_52;
    uVar8 = uVar8 & local_34 ^ local_3e;
    local_2c = local_2c ^ local_44 ^ local_26;
    uVar9 = local_30 ^ uVar8;
    uVar10 = local_5a ^ local_38 ^ local_2a;
    uVar5 = uVar5 & local_4c ^ local_30 ^ local_5c;
    in_RDI[7] = local_2c ^ local_3e ^ uVar2 ^ local_42 ^ local_5a;
    in_RDI[6] = local_52 ^ uVar3 ^ uVar9 ^ local_42 ^ local_5a ^ 0xffff;
    in_RDI[5] = uVar4 ^ local_38 ^ local_2a ^ uVar5 ^ local_42 ^ local_26 ^ 0xffff;
    in_RDI[4] = local_2c ^ uVar2 ^ uVar9;
    in_RDI[3] = uVar3 ^ uVar2 ^ uVar8 ^ local_5c ^ local_46;
    in_RDI[2] = local_2c ^ uVar10 ^ uVar5 ^ uVar7 ^ uVar2;
    in_RDI[1] = local_36 ^ uVar3 ^ local_46 ^ uVar6 ^ uVar10 ^ 0xffff;
    *in_RDI = local_2c ^ local_2a ^ local_46 ^ uVar6 ^ local_30 ^ local_5c ^ 0xffff;
  }
  else {
    uVar3 = local_38 ^ local_2c;
    uVar8 = uVar8 & local_34 ^ local_36;
    uVar2 = local_44 ^ uVar5 & local_4c;
    uVar5 = local_42 ^ local_26 ^ local_2a ^ uVar6;
    uVar9 = uVar7 ^ local_5c ^ local_52;
    uVar10 = local_42 ^ local_26 ^ uVar8;
    uVar11 = uVar5 ^ local_36 ^ local_5a;
    in_RDI[7] = local_44 ^ local_46 ^ uVar3 ^ uVar5;
    in_RDI[6] = local_3e ^ uVar4 ^ uVar10 ^ local_38 ^ uVar6 ^ local_5c ^ local_52 ^ uVar2;
    in_RDI[5] = local_2a ^ uVar3 ^ uVar10 ^ uVar2 ^ uVar9;
    in_RDI[4] = local_30 ^ local_5c ^ uVar3 ^ uVar5;
    in_RDI[3] = uVar11 ^ uVar9 ^ uVar4 ^ local_30 ^ local_46;
    in_RDI[2] = uVar3 ^ uVar8 ^ local_30 ^ local_46 ^ uVar5;
    in_RDI[1] = local_44 ^ local_2c ^ uVar11;
    *in_RDI = local_3e ^ uVar4 ^ uVar7 ^ local_26;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void SubBytes(AES_state *s, int inv) {
    /* Load the bit slices */
    uint16_t U0 = s->slice[7], U1 = s->slice[6], U2 = s->slice[5], U3 = s->slice[4];
    uint16_t U4 = s->slice[3], U5 = s->slice[2], U6 = s->slice[1], U7 = s->slice[0];

    uint16_t T1, T2, T3, T4, T5, T6, T7, T8, T9, T10, T11, T12, T13, T14, T15, T16;
    uint16_t T17, T18, T19, T20, T21, T22, T23, T24, T25, T26, T27, D;
    uint16_t M1, M6, M11, M13, M15, M20, M21, M22, M23, M25, M37, M38, M39, M40;
    uint16_t M41, M42, M43, M44, M45, M46, M47, M48, M49, M50, M51, M52, M53, M54;
    uint16_t M55, M56, M57, M58, M59, M60, M61, M62, M63;

    if (inv) {
        uint16_t R5, R13, R17, R18, R19;
        /* Undo linear postprocessing */
        T23 = U0 ^ U3;
        T22 = ~(U1 ^ U3);
        T2 = ~(U0 ^ U1);
        T1 = U3 ^ U4;
        T24 = ~(U4 ^ U7);
        R5 = U6 ^ U7;
        T8 = ~(U1 ^ T23);
        T19 = T22 ^ R5;
        T9 = ~(U7 ^ T1);
        T10 = T2 ^ T24;
        T13 = T2 ^ R5;
        T3 = T1 ^ R5;
        T25 = ~(U2 ^ T1);
        R13 = U1 ^ U6;
        T17 = ~(U2 ^ T19);
        T20 = T24 ^ R13;
        T4 = U4 ^ T8;
        R17 = ~(U2 ^ U5);
        R18 = ~(U5 ^ U6);
        R19 = ~(U2 ^ U4);
        D = U0 ^ R17;
        T6 = T22 ^ R17;
        T16 = R13 ^ R19;
        T27 = T1 ^ R18;
        T15 = T10 ^ T27;
        T14 = T10 ^ R18;
        T26 = T3 ^ T16;
    } else {
        /* Linear preprocessing. */
        T1 = U0 ^ U3;
        T2 = U0 ^ U5;
        T3 = U0 ^ U6;
        T4 = U3 ^ U5;
        T5 = U4 ^ U6;
        T6 = T1 ^ T5;
        T7 = U1 ^ U2;
        T8 = U7 ^ T6;
        T9 = U7 ^ T7;
        T10 = T6 ^ T7;
        T11 = U1 ^ U5;
        T12 = U2 ^ U5;
        T13 = T3 ^ T4;
        T14 = T6 ^ T11;
        T15 = T5 ^ T11;
        T16 = T5 ^ T12;
        T17 = T9 ^ T16;
        T18 = U3 ^ U7;
        T19 = T7 ^ T18;
        T20 = T1 ^ T19;
        T21 = U6 ^ U7;
        T22 = T7 ^ T21;
        T23 = T2 ^ T22;
        T24 = T2 ^ T10;
        T25 = T20 ^ T17;
        T26 = T3 ^ T16;
        T27 = T1 ^ T12;
        D = U7;
    }

    /* Non-linear transformation (shared between the forward and backward case) */
    M1 = T13 & T6;
    M6 = T3 & T16;
    M11 = T1 & T15;
    M13 = (T4 & T27) ^ M11;
    M15 = (T2 & T10) ^ M11;
    M20 = T14 ^ M1 ^ (T23 & T8) ^ M13;
    M21 = (T19 & D) ^ M1 ^ T24 ^ M15;
    M22 = T26 ^ M6 ^ (T22 & T9) ^ M13;
    M23 = (T20 & T17) ^ M6 ^ M15 ^ T25;
    M25 = M22 & M20;
    M37 = M21 ^ ((M20 ^ M21) & (M23 ^ M25));
    M38 = M20 ^ M25 ^ (M21 | (M20 & M23));
    M39 = M23 ^ ((M22 ^ M23) & (M21 ^ M25));
    M40 = M22 ^ M25 ^ (M23 | (M21 & M22));
    M41 = M38 ^ M40;
    M42 = M37 ^ M39;
    M43 = M37 ^ M38;
    M44 = M39 ^ M40;
    M45 = M42 ^ M41;
    M46 = M44 & T6;
    M47 = M40 & T8;
    M48 = M39 & D;
    M49 = M43 & T16;
    M50 = M38 & T9;
    M51 = M37 & T17;
    M52 = M42 & T15;
    M53 = M45 & T27;
    M54 = M41 & T10;
    M55 = M44 & T13;
    M56 = M40 & T23;
    M57 = M39 & T19;
    M58 = M43 & T3;
    M59 = M38 & T22;
    M60 = M37 & T20;
    M61 = M42 & T1;
    M62 = M45 & T4;
    M63 = M41 & T2;

    if (inv){
        /* Undo linear preprocessing */
        uint16_t P0 = M52 ^ M61;
        uint16_t P1 = M58 ^ M59;
        uint16_t P2 = M54 ^ M62;
        uint16_t P3 = M47 ^ M50;
        uint16_t P4 = M48 ^ M56;
        uint16_t P5 = M46 ^ M51;
        uint16_t P6 = M49 ^ M60;
        uint16_t P7 = P0 ^ P1;
        uint16_t P8 = M50 ^ M53;
        uint16_t P9 = M55 ^ M63;
        uint16_t P10 = M57 ^ P4;
        uint16_t P11 = P0 ^ P3;
        uint16_t P12 = M46 ^ M48;
        uint16_t P13 = M49 ^ M51;
        uint16_t P14 = M49 ^ M62;
        uint16_t P15 = M54 ^ M59;
        uint16_t P16 = M57 ^ M61;
        uint16_t P17 = M58 ^ P2;
        uint16_t P18 = M63 ^ P5;
        uint16_t P19 = P2 ^ P3;
        uint16_t P20 = P4 ^ P6;
        uint16_t P22 = P2 ^ P7;
        uint16_t P23 = P7 ^ P8;
        uint16_t P24 = P5 ^ P7;
        uint16_t P25 = P6 ^ P10;
        uint16_t P26 = P9 ^ P11;
        uint16_t P27 = P10 ^ P18;
        uint16_t P28 = P11 ^ P25;
        uint16_t P29 = P15 ^ P20;
        s->slice[7] = P13 ^ P22;
        s->slice[6] = P26 ^ P29;
        s->slice[5] = P17 ^ P28;
        s->slice[4] = P12 ^ P22;
        s->slice[3] = P23 ^ P27;
        s->slice[2] = P19 ^ P24;
        s->slice[1] = P14 ^ P23;
        s->slice[0] = P9 ^ P16;
    } else {
        /* Linear postprocessing */
        uint16_t L0 = M61 ^ M62;
        uint16_t L1 = M50 ^ M56;
        uint16_t L2 = M46 ^ M48;
        uint16_t L3 = M47 ^ M55;
        uint16_t L4 = M54 ^ M58;
        uint16_t L5 = M49 ^ M61;
        uint16_t L6 = M62 ^ L5;
        uint16_t L7 = M46 ^ L3;
        uint16_t L8 = M51 ^ M59;
        uint16_t L9 = M52 ^ M53;
        uint16_t L10 = M53 ^ L4;
        uint16_t L11 = M60 ^ L2;
        uint16_t L12 = M48 ^ M51;
        uint16_t L13 = M50 ^ L0;
        uint16_t L14 = M52 ^ M61;
        uint16_t L15 = M55 ^ L1;
        uint16_t L16 = M56 ^ L0;
        uint16_t L17 = M57 ^ L1;
        uint16_t L18 = M58 ^ L8;
        uint16_t L19 = M63 ^ L4;
        uint16_t L20 = L0 ^ L1;
        uint16_t L21 = L1 ^ L7;
        uint16_t L22 = L3 ^ L12;
        uint16_t L23 = L18 ^ L2;
        uint16_t L24 = L15 ^ L9;
        uint16_t L25 = L6 ^ L10;
        uint16_t L26 = L7 ^ L9;
        uint16_t L27 = L8 ^ L10;
        uint16_t L28 = L11 ^ L14;
        uint16_t L29 = L11 ^ L17;
        s->slice[7] = L6 ^ L24;
        s->slice[6] = ~(L16 ^ L26);
        s->slice[5] = ~(L19 ^ L28);
        s->slice[4] = L6 ^ L21;
        s->slice[3] = L20 ^ L22;
        s->slice[2] = L25 ^ L29;
        s->slice[1] = ~(L13 ^ L27);
        s->slice[0] = ~(L6 ^ L23);
    }
}